

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void ev3dev::led::set_color
               (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *group,
               vector<float,_std::allocator<float>_> *color)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  string local_50 [40];
  
  uVar1 = (long)(group->super__Vector_base<ev3dev::led_*,_std::allocator<ev3dev::led_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(group->super__Vector_base<ev3dev::led_*,_std::allocator<ev3dev::led_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar2 = (long)(color->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(color->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    set_brightness_pct((led *)local_50,
                       (group->super__Vector_base<ev3dev::led_*,_std::allocator<ev3dev::led_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar1],
                       (color->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar1]);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void led::set_color(const std::vector<led*> &group, const std::vector<float> &color) {
    const size_t n = std::min(group.size(), color.size());
    for(size_t i = 0; i < n; ++i)
        group[i]->set_brightness_pct(color[i]);
}